

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  ParseInfoTree *this_00;
  bool bVar1;
  int iVar2;
  ParseInfoTree *pPVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *this_01;
  string delimeter;
  allocator<char> local_b1;
  string local_b0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  this_00 = this->parse_info_tree_;
  if (this_00 != (ParseInfoTree *)0x0) {
    pPVar3 = ParseInfoTree::CreateNested(this_00,field);
    this->parse_info_tree_ = pPVar3;
  }
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"<",&local_b1);
  bVar1 = TryConsume(this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (bVar1) {
LAB_0022119e:
    std::__cxx11::string::assign((char *)&local_90);
    if (*(int *)(field + 0x30) == 3) {
      iVar2 = (*reflection->_vptr_Reflection[0x41])(reflection,message,field,0);
      std::__cxx11::string::string((string *)&local_50,(string *)&local_90);
      bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var,iVar2),&local_50);
      this_01 = &local_50;
    }
    else {
      iVar2 = (*reflection->_vptr_Reflection[0x21])(reflection,message,field,0);
      std::__cxx11::string::string((string *)&local_70,(string *)&local_90);
      bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var_00,iVar2),&local_70);
      this_01 = &local_70;
    }
    std::__cxx11::string::~string((string *)this_01);
    if (bVar1 != false) {
      this->parse_info_tree_ = this_00;
      bVar1 = true;
      goto LAB_0022123d;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"{",&local_b1);
    bVar1 = Consume(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar1) goto LAB_0022119e;
  }
  bVar1 = false;
LAB_0022123d:
  std::__cxx11::string::~string((string *)&local_90);
  return bVar1;
}

Assistant:

bool ConsumeFieldMessage(Message* message,
                           const Reflection* reflection,
                           const FieldDescriptor* field) {

    // If the parse information tree is not NULL, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != NULL) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    string delimeter;
    if (TryConsume("<")) {
      delimeter = ">";
    } else {
      DO(Consume("{"));
      delimeter = "}";
    }

    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field), delimeter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field),
                        delimeter));
    }

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }